

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::COperationsBuilder::AddMatchLeft_S
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  TOperationType TVar2;
  bool saveInTable_local;
  CQualifier *qualifier_local;
  COperationsBuilder *this_local;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    TVar2 = OT_MatchLeft_S;
    if (saveInTable) {
      TVar2 = OT_MatchLeftSaveToTable_S;
    }
    addNoArgumensOperation(this,TVar2);
  }
  else {
    TVar2 = OT_MatchLeftWithQualifier_S;
    if (saveInTable) {
      TVar2 = OT_MatchLeftWithQualifierSaveToTable_S;
    }
    addQualifierIndexOperation(this,TVar2,qualifier);
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchLeft_S( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchLeftSaveToTable_S : OT_MatchLeft_S ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchLeftWithQualifierSaveToTable_S :
			OT_MatchLeftWithQualifier_S ), qualifier );
	}
}